

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O1

void __thiscall ON_GradientColorData::Dump(ON_GradientColorData *this,ON_TextLog *text_log)

{
  char *format;
  
  switch(this->m_gradient_type) {
  case None:
    format = "None gradient\n";
    break;
  case Linear:
    format = "Linear gradient\n";
    break;
  case Radial:
    format = "Radial gradient\n";
    break;
  case LinearDisabled:
    format = "Linear(disabled) gradient\n";
    break;
  case RadialDisabled:
    ON_TextLog::Print(text_log,L"Radial(disabled) gradient\n");
  default:
    goto switchD_0049f756_default;
  }
  ON_TextLog::Print(text_log,format);
switchD_0049f756_default:
  ON_TextLog::PushIndent(text_log);
  ON_TextLog::Print(text_log,"points ");
  ON_TextLog::Print(text_log,&this->m_start);
  ON_TextLog::Print(text_log,"-");
  ON_TextLog::Print(text_log,&this->m_end);
  ON_TextLog::Print(text_log,"\nrepeat %d\n",this->m_repeat);
  ON_TextLog::PopIndent(text_log);
  return;
}

Assistant:

void ON_GradientColorData::Dump(ON_TextLog& text_log) const
{
  switch (m_gradient_type)
  {
  case ON_GradientType::None:
    text_log.Print("None gradient\n");
    break;
  case ON_GradientType::Linear:
    text_log.Print("Linear gradient\n");
    break;
  case ON_GradientType::Radial:
    text_log.Print("Radial gradient\n");
    break;
  case ON_GradientType::LinearDisabled:
    text_log.Print("Linear(disabled) gradient\n");
    break;
  case ON_GradientType::RadialDisabled:
    text_log.Print(L"Radial(disabled) gradient\n");
    break;
  default:
    break;
  }

  text_log.PushIndent();
  text_log.Print("points ");
  text_log.Print(m_start);
  text_log.Print("-");
  text_log.Print(m_end);
  text_log.Print("\nrepeat %d\n", m_repeat);
  text_log.PopIndent();
}